

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Element.cpp
# Opt level: O1

bool __thiscall Rml::Element::Project(Element *this,Vector2f *point)

{
  TransformState *this_00;
  float fVar1;
  float fVar2;
  float fVar3;
  float fVar4;
  Matrix4f *pMVar5;
  bool bVar6;
  float fVar7;
  float fVar8;
  float fVar9;
  float fVar10;
  float fVar11;
  VectorType local_48;
  VectorType local_38;
  
  this_00 = (this->transform_state)._M_t.
            super___uniq_ptr_impl<Rml::TransformState,_std::default_delete<Rml::TransformState>_>.
            _M_t.
            super__Tuple_impl<0UL,_Rml::TransformState_*,_std::default_delete<Rml::TransformState>_>
            .super__Head_base<0UL,_Rml::TransformState_*,_false>._M_head_impl;
  bVar6 = true;
  if ((this_00 != (TransformState *)0x0) &&
     (pMVar5 = TransformState::GetTransform(this_00), pMVar5 != (Matrix4f *)0x0)) {
    pMVar5 = TransformState::GetInverseTransform
                       ((this->transform_state)._M_t.
                        super___uniq_ptr_impl<Rml::TransformState,_std::default_delete<Rml::TransformState>_>
                        ._M_t.
                        super__Tuple_impl<0UL,_Rml::TransformState_*,_std::default_delete<Rml::TransformState>_>
                        .super__Head_base<0UL,_Rml::TransformState_*,_false>._M_head_impl);
    if (pMVar5 != (Matrix4f *)0x0) {
      local_48.z = -10.0;
      local_48.w = 1.0;
      local_48.x = point->x;
      local_48.y = point->y;
      local_38.z = 10.0;
      local_38.w = 1.0;
      local_38.x = point->x;
      local_38.y = point->y;
      local_48 = Matrix4<float,_Rml::ColumnMajorStorage<float>_>::
                 VectorMultiplier<float,_Rml::ColumnMajorStorage<float>_>::Multiply
                           (pMVar5,&local_48);
      local_38 = Matrix4<float,_Rml::ColumnMajorStorage<float>_>::
                 VectorMultiplier<float,_Rml::ColumnMajorStorage<float>_>::Multiply
                           (pMVar5,&local_38);
      fVar1 = local_48.w;
      fVar11 = local_48.x;
      fVar9 = local_48.y;
      fVar10 = local_48.z / local_48.w;
      fVar4 = local_38.w;
      fVar2 = local_38.x;
      fVar3 = local_38.y;
      fVar7 = local_38.z / local_38.w - fVar10;
      fVar8 = Math::Absolute(fVar7);
      if (1.0 < fVar8) {
        fVar11 = fVar11 / fVar1;
        fVar9 = fVar9 / fVar1;
        fVar7 = -fVar10 / fVar7;
        point->x = (fVar2 / fVar4 - fVar11) * fVar7 + fVar11;
        point->y = fVar7 * (fVar3 / fVar4 - fVar9) + fVar9;
        return true;
      }
    }
    bVar6 = false;
  }
  return bVar6;
}

Assistant:

bool Element::Project(Vector2f& point) const noexcept
{
	if (!transform_state || !transform_state->GetTransform())
		return true;

	// The input point is in window coordinates. Need to find the projection of the point onto the current element plane,
	// taking into account the full transform applied to the element.

	if (const Matrix4f* inv_transform = transform_state->GetInverseTransform())
	{
		// Pick two points forming a line segment perpendicular to the window.
		Vector4f window_points[2] = {{point.x, point.y, -10, 1}, {point.x, point.y, 10, 1}};

		// Project them into the local element space.
		window_points[0] = *inv_transform * window_points[0];
		window_points[1] = *inv_transform * window_points[1];

		Vector3f local_points[2] = {window_points[0].PerspectiveDivide(), window_points[1].PerspectiveDivide()};

		// Construct a ray from the two projected points in the local space of the current element.
		// Find the intersection with the z=0 plane to produce our destination point.
		Vector3f ray = local_points[1] - local_points[0];

		// Only continue if we are not close to parallel with the plane.
		if (Math::Absolute(ray.z) > 1.0f)
		{
			// Solving the line equation p = p0 + t*ray for t, knowing that p.z = 0, produces the following.
			float t = -local_points[0].z / ray.z;
			Vector3f p = local_points[0] + ray * t;

			point = Vector2f(p.x, p.y);
			return true;
		}
	}

	// The transformation matrix is either singular, or the ray is parallel to the element's plane.
	return false;
}